

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_tlm.cpp
# Opt level: O1

void __thiscall
CmdTlm::blobs(CmdTlm *this,vector<Commands::Blob,_std::allocator<Commands::Blob>_> *blobs)

{
  PacketWriter *pPVar1;
  pointer pBVar2;
  long lVar3;
  Blob *blob;
  pointer pBVar4;
  long lVar5;
  undefined1 local_33;
  undefined1 local_32 [2];
  
  pPVar1 = this->packetWriter;
  lVar5 = *(long *)((long)*pPVar1 + -0x20);
  lVar3 = (long)&pPVar1->field_0x0 + lVar5;
  (*(code *)**(undefined8 **)((long)&pPVar1->field_0x0 + lVar5))(lVar3,&local_33,1);
  (*(code *)**(undefined8 **)((long)&pPVar1->field_0x0 + lVar5))(lVar3,local_32,2);
  pBVar2 = (blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar4 = (blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>)._M_impl
                .super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
    pPVar1 = this->packetWriter;
    lVar3 = *(long *)((long)*pPVar1 + -0x20);
    lVar5 = (long)&pPVar1->field_0x0 + lVar3;
    (*(code *)**(undefined8 **)((long)&pPVar1->field_0x0 + lVar3))(lVar5,pBVar4,4);
    (*(code *)**(undefined8 **)((long)&pPVar1->field_0x0 + lVar3))(lVar5,&pBVar4->y,4);
    (*(code *)**(undefined8 **)((long)&pPVar1->field_0x0 + lVar3))(lVar5,&pBVar4->size,4);
  }
  (**(code **)((long)*this->packetWriter + 8))();
  return;
}

Assistant:

void  CmdTlm::blobs(vector<Blob> & blobs) {
  *packetWriter << (uint8_t) 4 << (uint16_t) blobs.size();
  for (Blob &blob : blobs) {
    *packetWriter << blob.x << blob.y << blob.size;
  }
  packetWriter->write_packet();
}